

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_decompress_safe_withPrefix64k(char *source,char *dest,int compressedSize,int maxOutputSize)

{
  byte *pbVar1;
  byte *pbVar2;
  char *pcVar3;
  byte bVar4;
  char cVar5;
  ushort uVar6;
  undefined8 uVar7;
  ushort uVar8;
  BYTE *s_1;
  ushort *puVar9;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  byte *pbVar13;
  size_t __n;
  ushort *puVar14;
  uint uVar15;
  int iVar16;
  char *pcVar17;
  BYTE *d_2;
  ushort *__src;
  char *pcVar18;
  long lVar19;
  long lVar20;
  BYTE *s;
  byte *pbVar21;
  long lVar22;
  char *pcVar23;
  uint uVar24;
  BYTE *d_3;
  ulong uVar25;
  char *pcVar26;
  ushort *puVar27;
  ushort *puVar28;
  int local_48;
  
  iVar16 = -1;
  if (-1 < maxOutputSize && source != (char *)0x0) {
    if (maxOutputSize == 0) {
      if (compressedSize == 1) {
        iVar16 = -(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      pbVar1 = (byte *)(source + compressedSize);
      uVar12 = (ulong)(uint)maxOutputSize;
      if (0x3f < (uint)maxOutputSize) {
        puVar27 = (ushort *)(pbVar1 + -0xf);
        lVar20 = 0;
        puVar9 = (ushort *)source;
LAB_00112254:
        do {
          pcVar10 = dest + lVar20;
          __src = (ushort *)((long)puVar9 + 1);
          bVar4 = (byte)*puVar9;
          uVar24 = (uint)bVar4;
          __n = (size_t)(uint)(bVar4 >> 4);
          if (bVar4 >> 4 == 0xf) {
            puVar28 = __src;
            if ((puVar27 <= __src) || (puVar28 = puVar9 + 1, puVar27 < puVar28)) goto LAB_0011255b;
            uVar25 = (ulong)*(byte *)__src;
            if (uVar25 == 0xff) {
              uVar25 = 0xff;
              puVar9 = puVar28;
              do {
                puVar28 = (ushort *)((long)puVar9 + 1);
                if (puVar27 < puVar28) goto LAB_0011255b;
                uVar6 = *puVar9;
                uVar25 = uVar25 + (byte)uVar6;
                puVar9 = puVar28;
              } while ((ulong)(byte)uVar6 == 0xff);
              if (uVar25 == 0xffffffffffffffff) goto LAB_0011255b;
            }
            __n = uVar25 + 0xf;
            puVar14 = (ushort *)((long)puVar28 + __n);
            if ((CARRY8((ulong)pcVar10,__n)) || (CARRY8((ulong)puVar28,__n))) goto LAB_0011255b;
            lVar19 = __n + lVar20;
            __src = puVar28;
            if (dest + (uVar12 - 0x20) < dest + lVar19) goto LAB_0011264c;
            if (pbVar1 + -0x20 < puVar14) goto LAB_0011264c;
            lVar20 = 0;
            do {
              uVar7 = *(undefined8 *)((byte *)((long)puVar28 + lVar20) + 8);
              pcVar3 = pcVar10 + lVar20;
              *(undefined8 *)pcVar3 = *(undefined8 *)((long)puVar28 + lVar20);
              *(undefined8 *)(pcVar3 + 8) = uVar7;
              pbVar13 = (byte *)((long)puVar28 + lVar20 + 0x10);
              uVar7 = *(undefined8 *)(pbVar13 + 8);
              *(undefined8 *)(pcVar3 + 0x10) = *(undefined8 *)pbVar13;
              *(undefined8 *)(pcVar3 + 0x18) = uVar7;
              lVar20 = lVar20 + 0x20;
            } while (pcVar3 + 0x20 < dest + lVar19);
          }
          else {
            if (pbVar1 + -0x11 < __src) goto LAB_0011264c;
            uVar7 = *(undefined8 *)((long)puVar9 + 9);
            *(undefined8 *)pcVar10 = *(undefined8 *)__src;
            *(undefined8 *)(pcVar10 + 8) = uVar7;
            puVar14 = (ushort *)((long)__src + __n);
            lVar19 = lVar20 + __n;
          }
          pbVar13 = (byte *)(dest + lVar19);
          uVar6 = *puVar14;
          uVar11 = (ulong)uVar6;
          uVar15 = (uint)uVar6;
          puVar9 = puVar14 + 1;
          lVar22 = lVar19 - uVar11;
          pbVar21 = (byte *)(dest + lVar22);
          uVar25 = (ulong)(bVar4 & 0xf);
          if (uVar25 == 0xf) {
            puVar14 = (ushort *)((long)puVar14 + 3);
            puVar28 = puVar14;
            if (pbVar1 + -4 < puVar14) goto LAB_0011255b;
            uVar25 = (ulong)(byte)*puVar9;
            if (uVar25 == 0xff) {
              uVar25 = 0xff;
              puVar9 = puVar14;
              do {
                puVar14 = (ushort *)((long)puVar9 + 1);
                puVar28 = puVar14;
                if (pbVar1 + -4 < puVar14) goto LAB_0011255b;
                uVar8 = *puVar9;
                uVar25 = uVar25 + (byte)uVar8;
                puVar9 = puVar14;
              } while ((ulong)(byte)uVar8 == 0xff);
              if (uVar25 == 0xffffffffffffffff) goto LAB_0011255b;
            }
            uVar25 = uVar25 + 0x13;
            puVar28 = puVar14;
            if (CARRY8((ulong)pbVar13,uVar25)) goto LAB_0011255b;
            puVar9 = puVar14;
            if (dest + (uVar12 - 0x40) <= pbVar13 + uVar25) goto LAB_001126f3;
          }
          else {
            lVar20 = lVar19 + uVar25 + 4;
            uVar25 = uVar25 + 4;
            puVar14 = puVar9;
            if (dest + (uVar12 - 0x40) <= dest + lVar20) goto LAB_001126f3;
            if (7 < uVar6) {
              *(undefined8 *)pbVar13 = *(undefined8 *)pbVar21;
              *(undefined8 *)(pbVar13 + 8) = *(undefined8 *)(pbVar21 + 8);
              *(undefined2 *)(pbVar13 + 0x10) = *(undefined2 *)(pbVar21 + 0x10);
              goto LAB_00112254;
            }
          }
          puVar28 = puVar9;
          if (lVar22 < -0x10000) goto LAB_0011255b;
          lVar20 = uVar25 + lVar19;
          pbVar2 = (byte *)(dest + lVar20);
          if (uVar6 < 0x10) {
            if (uVar11 == 4) {
              iVar16 = *(int *)pbVar21;
            }
            else if (uVar6 == 2) {
              iVar16 = CONCAT22(*(undefined2 *)pbVar21,*(undefined2 *)pbVar21);
            }
            else {
              if (uVar6 != 1) {
                if (uVar6 < 8) {
                  pbVar13[0] = 0;
                  pbVar13[1] = 0;
                  pbVar13[2] = 0;
                  pbVar13[3] = 0;
                  *pbVar13 = *pbVar21;
                  pbVar13[1] = pbVar21[1];
                  pbVar13[2] = pbVar21[2];
                  pbVar13[3] = pbVar21[3];
                  uVar24 = inc32table[uVar6];
                  *(undefined4 *)(pbVar13 + 4) = *(undefined4 *)(pbVar21 + uVar24);
                  pbVar21 = pbVar21 + ((ulong)uVar24 - (long)dec64table[uVar6]);
                }
                else {
                  *(undefined8 *)pbVar13 = *(undefined8 *)pbVar21;
                  pbVar21 = pbVar21 + 8;
                }
                pbVar13 = pbVar13 + 8;
                do {
                  *(undefined8 *)pbVar13 = *(undefined8 *)pbVar21;
                  pbVar13 = pbVar13 + 8;
                  pbVar21 = pbVar21 + 8;
                } while (pbVar13 < pbVar2);
                goto LAB_00112254;
              }
              iVar16 = (uint)*pbVar21 * 0x1010101;
            }
            do {
              *(int *)pbVar13 = iVar16;
              *(int *)(pbVar13 + 4) = iVar16;
              pbVar13 = pbVar13 + 8;
            } while (pbVar13 < pbVar2);
            goto LAB_00112254;
          }
          do {
            uVar7 = *(undefined8 *)(pbVar13 + -uVar11 + 8);
            *(undefined8 *)pbVar13 = *(undefined8 *)(pbVar13 + -uVar11);
            *(undefined8 *)(pbVar13 + 8) = uVar7;
            uVar7 = *(undefined8 *)(pbVar13 + -uVar11 + 0x10 + 8);
            *(undefined8 *)(pbVar13 + 0x10) = *(undefined8 *)(pbVar13 + -uVar11 + 0x10);
            *(undefined8 *)(pbVar13 + 0x18) = uVar7;
            pbVar13 = pbVar13 + 0x20;
          } while (pbVar13 < pbVar2);
        } while( true );
      }
      lVar20 = 0;
      puVar14 = (ushort *)source;
      do {
        __src = (ushort *)((long)puVar14 + 1);
        bVar4 = (byte)*puVar14;
        lVar19 = lVar20;
        while( true ) {
          pcVar10 = dest + lVar19;
          uVar24 = (uint)bVar4;
          if (bVar4 >> 4 == 0xf) break;
          __n = (size_t)(uint)(bVar4 >> 4);
          if ((source + (long)compressedSize + -0x10 <= __src) || (dest + (uVar12 - 0x20) < pcVar10)
             ) goto LAB_0011264c;
          uVar7 = *(undefined8 *)(__src + 4);
          *(undefined8 *)pcVar10 = *(undefined8 *)__src;
          *(undefined8 *)(pcVar10 + 8) = uVar7;
          lVar19 = lVar20 + __n;
          uVar25 = (ulong)(uVar24 & 0xf);
          puVar14 = (ushort *)((long)__src + __n) + 1;
          uVar6 = *(ushort *)((long)__src + __n);
          uVar15 = (uint)uVar6;
          lVar22 = lVar19 - (ulong)uVar6;
          if (((uVar24 & 0xf) == 0xf) || (uVar6 < 8)) goto LAB_0011269d;
          *(undefined8 *)(dest + lVar19) = *(undefined8 *)(dest + lVar22);
          *(undefined8 *)(dest + lVar19 + 8) = *(undefined8 *)(dest + lVar22 + 8);
          *(undefined2 *)(dest + lVar19 + 0x10) = *(undefined2 *)(dest + lVar22 + 0x10);
          lVar20 = lVar19 + uVar25 + 4;
          lVar19 = uVar25 + lVar19 + 4;
          bVar4 = *(byte *)((long)__src + __n + 2);
          __src = (ushort *)((long)__src + __n + 3);
        }
        puVar27 = (ushort *)(pbVar1 + -0xf);
        puVar28 = __src;
        if ((puVar27 <= __src) || (puVar28 = puVar14 + 1, puVar27 < puVar28)) goto LAB_0011255b;
        uVar25 = (ulong)(byte)*__src;
        if (uVar25 == 0xff) {
          uVar25 = 0xff;
          do {
            puVar9 = puVar28;
            puVar28 = (ushort *)((long)puVar9 + 1);
            if (puVar27 < puVar28) goto LAB_0011285c;
            uVar25 = uVar25 + (byte)*puVar9;
          } while ((ulong)(byte)*puVar9 == 0xff);
          if (uVar25 == 0xffffffffffffffff) {
LAB_0011285c:
            puVar28 = (ushort *)((long)puVar9 + 1);
LAB_0011255b:
            local_48 = (int)source;
            return ~(uint)puVar28 + local_48;
          }
        }
        __n = uVar25 + 0xf;
        if ((CARRY8((ulong)pcVar10,__n)) || (__src = puVar28, CARRY8((ulong)puVar28,__n)))
        goto LAB_0011255b;
LAB_0011264c:
        pcVar10 = dest + lVar20;
        lVar19 = lVar20 + __n;
        if ((dest + (uVar12 - 0xc) < dest + lVar19) ||
           (puVar27 = (ushort *)((long)__src + __n), pbVar1 + -8 < puVar27)) {
          puVar28 = __src;
          if (((byte *)((long)__src + __n) == pbVar1) && (lVar19 <= (long)uVar12)) {
            memmove(pcVar10,__src,__n);
            return (int)lVar19;
          }
          goto LAB_0011255b;
        }
        do {
          *(undefined8 *)pcVar10 = *(undefined8 *)__src;
          pcVar10 = pcVar10 + 8;
          __src = __src + 4;
        } while (pcVar10 < dest + lVar19);
        uVar15 = (uint)*puVar27;
        puVar14 = puVar27 + 1;
        lVar22 = lVar19 - (ulong)*puVar27;
        uVar25 = (ulong)(uVar24 & 0xf);
LAB_0011269d:
        puVar28 = puVar14;
        if ((int)uVar25 == 0xf) {
          puVar28 = (ushort *)((long)puVar14 + 1);
          if (pbVar1 + -4 < puVar28) goto LAB_0011255b;
          uVar11 = (ulong)(byte)*puVar14;
          if (uVar11 == 0xff) {
            uVar11 = 0xff;
            puVar27 = puVar28;
            do {
              puVar28 = (ushort *)((long)puVar27 + 1);
              if (pbVar1 + -4 < puVar28) {
                puVar28 = (ushort *)((long)puVar27 + 1);
                goto LAB_0011255b;
              }
              uVar6 = *puVar27;
              uVar11 = uVar11 + (byte)uVar6;
              puVar27 = puVar28;
            } while ((ulong)(byte)uVar6 == 0xff);
          }
          uVar25 = uVar11 + 0xf;
          if ((uVar11 == 0xffffffffffffffff) || (CARRY8((ulong)(dest + lVar19),uVar25)))
          goto LAB_0011255b;
        }
        uVar25 = uVar25 + 4;
        puVar14 = puVar28;
LAB_001126f3:
        puVar28 = puVar14;
        if (lVar22 < -0x10000) goto LAB_0011255b;
        pcVar10 = dest + lVar19;
        pcVar23 = dest + lVar22;
        lVar20 = lVar19 + uVar25;
        pcVar3 = dest + lVar20;
        if (uVar15 < 8) {
          pcVar10[0] = '\0';
          pcVar10[1] = '\0';
          pcVar10[2] = '\0';
          pcVar10[3] = '\0';
          *pcVar10 = *pcVar23;
          pcVar10[1] = pcVar23[1];
          pcVar10[2] = pcVar23[2];
          pcVar10[3] = pcVar23[3];
          uVar11 = (ulong)*(uint *)((long)inc32table + (ulong)(uVar15 << 2));
          *(undefined4 *)(pcVar10 + 4) = *(undefined4 *)(pcVar23 + uVar11);
          pcVar23 = pcVar23 + (uVar11 - (long)*(int *)((long)dec64table + (ulong)(uVar15 << 2)));
        }
        else {
          *(undefined8 *)pcVar10 = *(undefined8 *)pcVar23;
          pcVar23 = pcVar23 + 8;
        }
        pcVar17 = pcVar10 + 8;
        if (dest + (uVar12 - 0xc) < pcVar3) {
          if (dest + (uVar12 - 5) < pcVar3) goto LAB_0011255b;
          pcVar10 = dest + (uVar12 - 7);
          pcVar18 = pcVar23;
          pcVar26 = pcVar17;
          if (pcVar17 < pcVar10) {
            do {
              *(undefined8 *)pcVar26 = *(undefined8 *)pcVar18;
              pcVar26 = pcVar26 + 8;
              pcVar18 = pcVar18 + 8;
            } while (pcVar26 < pcVar10);
            pcVar23 = pcVar23 + ((long)pcVar10 - (long)pcVar17);
            pcVar17 = pcVar10;
          }
          for (; pcVar17 < pcVar3; pcVar17 = pcVar17 + 1) {
            cVar5 = *pcVar23;
            pcVar23 = pcVar23 + 1;
            *pcVar17 = cVar5;
          }
        }
        else {
          *(undefined8 *)pcVar17 = *(undefined8 *)pcVar23;
          if (0x10 < uVar25) {
            pcVar10 = pcVar10 + 0x10;
            do {
              pcVar23 = pcVar23 + 8;
              *(undefined8 *)pcVar10 = *(undefined8 *)pcVar23;
              pcVar10 = pcVar10 + 8;
            } while (pcVar10 < pcVar3);
          }
        }
      } while( true );
    }
  }
  return iVar16;
}

Assistant:

LZ4_FORCE_O2 /* Exported, an obsolete API function. */
int LZ4_decompress_safe_withPrefix64k(const char* source, char* dest, int compressedSize, int maxOutputSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxOutputSize,
                                  decode_full_block, withPrefix64k,
                                  (BYTE*)dest - 64 KB, NULL, 0);
}